

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86ADD(uchar *stream,x86Reg dst,int num)

{
  int iVar1;
  uchar *puVar2;
  byte bVar3;
  
  if (8 < (int)dst) {
    *stream = 'A';
  }
  puVar2 = stream + (8 < (int)dst);
  if ((char)(uchar)num == num) {
    *puVar2 = 0x83;
    bVar3 = regCode[dst];
    puVar2[2] = (uchar)num;
    iVar1 = 3;
  }
  else {
    *puVar2 = 0x81;
    bVar3 = regCode[dst];
    *(int *)(puVar2 + 2) = num;
    iVar1 = 6;
  }
  puVar2[1] = bVar3 | 0xc0;
  return (iVar1 + (int)puVar2) - (int)stream;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}